

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_test.c
# Opt level: O0

void vdpp_test_set_img(vdpp_com_ctx *ctx,RK_U32 w,RK_U32 h,VdppImg *img,RK_S32 fd,VdppCmd cmd)

{
  MPP_RET MVar1;
  MPP_RET ret;
  RK_S32 y_size;
  VdppCmd cmd_local;
  RK_S32 fd_local;
  VdppImg *img_local;
  RK_U32 h_local;
  RK_U32 w_local;
  vdpp_com_ctx *ctx_local;
  
  img->mem_addr = fd;
  img->uv_addr = fd;
  img->uv_off = w * h;
  MVar1 = (*ctx->ops->control)(ctx->priv,cmd,img);
  if (MVar1 != MPP_OK) {
    _mpp_log_l(4,"vdpp_test","control %08x failed %d\n","vdpp_test_set_img",cmd,MVar1);
  }
  return;
}

Assistant:

static void vdpp_test_set_img(vdpp_com_ctx *ctx, RK_U32 w, RK_U32 h,
                              VdppImg *img, RK_S32 fd, VdppCmd cmd)
{
    RK_S32 y_size = w * h;

    img->mem_addr = fd;
    img->uv_addr = fd;
    img->uv_off = y_size;

    MPP_RET ret = ctx->ops->control(ctx->priv, cmd, img);
    if (ret)
        mpp_log_f("control %08x failed %d\n", cmd, ret);
}